

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_multi_statemach(connectdata *conn,_Bool *done)

{
  pop3_conn *pop3c;
  CURLcode result;
  _Bool *done_local;
  connectdata *conn_local;
  
  if (((conn->handler->flags & 1) == 0) || (((conn->proto).imapc.ssldone & 1U) != 0)) {
    conn_local._4_4_ = Curl_pp_statemach(&(conn->proto).ftpc.pp,false);
    *done = (conn->proto).imapc.state == IMAP_STOP;
  }
  else {
    conn_local._4_4_ = CURLE_NOT_BUILT_IN;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode pop3_multi_statemach(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;

  if((conn->handler->flags & PROTOPT_SSL) && !pop3c->ssldone) {
    result = Curl_ssl_connect_nonblocking(conn, FIRSTSOCKET, &pop3c->ssldone);
    if(result || !pop3c->ssldone)
      return result;
  }

  result = Curl_pp_statemach(&pop3c->pp, FALSE);
  *done = (pop3c->state == POP3_STOP) ? TRUE : FALSE;

  return result;
}